

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::post_piece_availability(torrent *this)

{
  alert_manager *this_00;
  undefined1 local_48 [40];
  vector<int,_piece_index_t> avail;
  torrent *this_local;
  
  avail.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
  ::container_wrapper((container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
                       *)(local_48 + 0x20));
  piece_availability(this,(container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
                           *)(local_48 + 0x20));
  this_00 = alerts(this);
  get_handle((torrent *)local_48);
  alert_manager::
  emplace_alert<libtorrent::piece_availability_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<int,std::allocator<int>>>>
            (this_00,(torrent_handle *)local_48,
             (container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
              *)(local_48 + 0x20));
  torrent_handle::~torrent_handle((torrent_handle *)local_48);
  container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
  ::~container_wrapper
            ((container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
              *)(local_48 + 0x20));
  return;
}

Assistant:

void torrent::post_piece_availability()
	{
		aux::vector<int, piece_index_t> avail;
		piece_availability(avail);
		alerts().emplace_alert<piece_availability_alert>(get_handle(), std::move(avail));
	}